

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycled.hpp
# Opt level: O1

void __thiscall
Lib::
Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>::
~Recycled(Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_Lib::NoReset,_Lib::DefaultKeepRecycled>
          *this)

{
  _Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false> _Var1;
  Stack<Indexing::CodeTree::CodeOp_*> *pSVar2;
  RemovingLiteralMatcher *in_RAX;
  Stack<std::unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>_>
  *this_00;
  _Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false> local_18;
  
  _Var1._M_head_impl =
       (this->_self)._M_t.
       super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
       .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>.
       _M_head_impl;
  local_18._M_head_impl = in_RAX;
  if ((_Var1._M_head_impl != (RemovingLiteralMatcher *)0x0) &&
     (((((Stack<Indexing::CodeTree::RemovingMatcher<false>::BTPoint> *)
        ((long)&(_Var1._M_head_impl)->super_RemovingMatcher<false> + 0x58))->_capacity != 0 ||
        *(size_t *)((long)&(_Var1._M_head_impl)->super_RemovingMatcher<false> + 0x20) != 0 ||
       ((pSVar2 = *(Stack<Indexing::CodeTree::CodeOp_*> **)
                   ((long)&(_Var1._M_head_impl)->super_RemovingMatcher<false> + 0x78),
        pSVar2 != (Stack<Indexing::CodeTree::CodeOp_*> *)0x0 && (pSVar2->_capacity != 0)))) &&
      (Recycled<Indexing::ClauseCodeTree::RemovingLiteralMatcher,Lib::NoReset,Lib::DefaultKeepRecycled>
       ::memAlive == '\x01')))) {
    this_00 = mem();
    local_18._M_head_impl =
         (this->_self)._M_t.
         super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
         ._M_t.
         super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
         .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>.
         _M_head_impl;
    (this->_self)._M_t.
    super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
    ._M_t.
    super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
    .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>._M_head_impl =
         (RemovingLiteralMatcher *)0x0;
    if (this_00->_cursor == this_00->_end) {
      Stack<std::unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>_>
      ::expand(this_00);
    }
    (this_00->_cursor->_M_t).
    super___uniq_ptr_impl<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
    ._M_t.
    super__Tuple_impl<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
    .super__Head_base<0UL,_Indexing::ClauseCodeTree::RemovingLiteralMatcher_*,_false>._M_head_impl =
         local_18._M_head_impl;
    local_18._M_head_impl = (RemovingLiteralMatcher *)0x0;
    this_00->_cursor = this_00->_cursor + 1;
    std::
    unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
    ::~unique_ptr((unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
                   *)&local_18);
  }
  std::
  unique_ptr<Indexing::ClauseCodeTree::RemovingLiteralMatcher,_std::default_delete<Indexing::ClauseCodeTree::RemovingLiteralMatcher>_>
  ::~unique_ptr(&this->_self);
  return;
}

Assistant:

~Recycled()
  {
    if (IF_USE_PTRS(_self, true) && _keep(self()) && memAlive) {
      _reset(self());
      mem().push(std::move(_self));
    }
  }